

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

char * __thiscall cmTarget::GetPrefixVariableInternal(cmTarget *this,ArtifactType artifact)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  allocator<char> local_31;
  string local_30;
  
  switch(this->TargetTypeValue) {
  case EXECUTABLE:
    if (artifact == ImportLibraryArtifact) {
      return "CMAKE_IMPORT_LIBRARY_PREFIX";
    }
    if ((artifact == RuntimeBinaryArtifact) && (this->IsAndroid == true)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_30,"ANDROID_GUI",&local_31);
      bVar1 = GetPropertyAsBool(this,&local_30);
      pcVar2 = "";
      if (bVar1) {
        pcVar2 = "CMAKE_SHARED_LIBRARY_PREFIX";
      }
      std::__cxx11::string::~string((string *)&local_30);
      return pcVar2;
    }
  default:
    return "";
  case STATIC_LIBRARY:
    return "CMAKE_STATIC_LIBRARY_PREFIX";
  case SHARED_LIBRARY:
    pcVar2 = "";
    if (artifact == ImportLibraryArtifact) {
      pcVar2 = "CMAKE_IMPORT_LIBRARY_PREFIX";
    }
    pcVar3 = "CMAKE_SHARED_LIBRARY_PREFIX";
    break;
  case MODULE_LIBRARY:
    pcVar2 = "";
    if (artifact == ImportLibraryArtifact) {
      pcVar2 = "CMAKE_IMPORT_LIBRARY_PREFIX";
    }
    pcVar3 = "CMAKE_SHARED_MODULE_PREFIX";
  }
  if (artifact != RuntimeBinaryArtifact) {
    pcVar3 = pcVar2;
  }
  return pcVar3;
}

Assistant:

const char* cmTargetPropertyComputer::GetSources<cmTarget>(
  cmTarget const* tgt, cmMessenger* messenger,
  cmListFileBacktrace const& context)
{
  cmStringRange entries = tgt->GetSourceEntries();
  if (entries.empty()) {
    return nullptr;
  }

  std::ostringstream ss;
  const char* sep = "";
  for (std::string const& entry : entries) {
    std::vector<std::string> files;
    cmSystemTools::ExpandListArgument(entry, files);
    for (std::string const& file : files) {
      if (cmHasLiteralPrefix(file, "$<TARGET_OBJECTS:") &&
          file.back() == '>') {
        std::string objLibName = file.substr(17, file.size() - 18);

        if (cmGeneratorExpression::Find(objLibName) != std::string::npos) {
          ss << sep;
          sep = ";";
          ss << file;
          continue;
        }

        bool addContent = false;
        bool noMessage = true;
        std::ostringstream e;
        MessageType messageType = MessageType::AUTHOR_WARNING;
        switch (context.GetBottom().GetPolicy(cmPolicies::CMP0051)) {
          case cmPolicies::WARN:
            e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0051) << "\n";
            noMessage = false;
          case cmPolicies::OLD:
            break;
          case cmPolicies::REQUIRED_ALWAYS:
          case cmPolicies::REQUIRED_IF_USED:
          case cmPolicies::NEW:
            addContent = true;
        }
        if (!noMessage) {
          e << "Target \"" << tgt->GetName()
            << "\" contains $<TARGET_OBJECTS> generator expression in its "
               "sources list.  This content was not previously part of the "
               "SOURCES property when that property was read at configure "
               "time.  Code reading that property needs to be adapted to "
               "ignore the generator expression using the string(GENEX_STRIP) "
               "command.";
          messenger->IssueMessage(messageType, e.str(), context);
        }
        if (addContent) {
          ss << sep;
          sep = ";";
          ss << file;
        }
      } else if (cmGeneratorExpression::Find(file) == std::string::npos) {
        ss << sep;
        sep = ";";
        ss << file;
      } else {
        cmSourceFile* sf = tgt->GetMakefile()->GetOrCreateSource(file);
        // Construct what is known about this source file location.
        cmSourceFileLocation const& location = sf->GetLocation();
        std::string sname = location.GetDirectory();
        if (!sname.empty()) {
          sname += "/";
        }
        sname += location.GetName();

        ss << sep;
        sep = ";";
        // Append this list entry.
        ss << sname;
      }
    }
  }
  static std::string srcs;
  srcs = ss.str();
  return srcs.c_str();
}